

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_avx2.c
# Opt level: O0

int aom_vector_var_avx2(int16_t *ref,int16_t *src,int bwl)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  int iVar6;
  byte in_DL;
  undefined1 (*in_RSI) [32];
  undefined1 (*in_RDI) [32];
  undefined1 auVar7 [32];
  uint mean_abs_3;
  int sse_int_3;
  int mean_int_3;
  __m128i result_3;
  __m256i sse_3;
  __m256i mean_3;
  __m256i ref_line;
  __m256i src_line;
  uint mean_abs_2;
  int sse_int_2;
  int mean_int_2;
  __m128i result_2;
  __m256i mean_2;
  __m256i sse_2;
  __m256i diff_sqr1;
  __m256i diff_sqr0;
  __m256i diff1;
  __m256i diff0;
  __m256i ref_line1;
  __m256i src_line1;
  __m256i ref_line0;
  __m256i src_line0;
  uint mean_abs_1;
  int sse_int_1;
  int mean_int_1;
  __m128i result_1;
  __m256i sse_1;
  __m256i mean_1;
  uint mean_abs;
  int sse_int;
  int mean_int;
  __m128i result;
  __m256i sse;
  __m256i mean;
  int var;
  int width;
  int local_af0;
  int iStackY_ae8;
  int local_a50;
  int iStackY_a48;
  __m256i *in_stack_fffffffffffff6d8;
  __m256i *in_stack_fffffffffffff6e0;
  int16_t *in_stack_fffffffffffff6e8;
  int16_t *in_stack_fffffffffffff6f0;
  int local_8f0;
  int iStack_8e8;
  int local_890;
  int iStack_888;
  undefined1 local_860 [32];
  int local_82c;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  iVar6 = 4 << (in_DL & 0x1f);
  local_82c = 0;
  if (iVar6 == 0x80) {
    local_860 = ZEXT1632(ZEXT816(0));
    calc_vector_mean_sse_64wd
              (in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0,
               in_stack_fffffffffffff6d8);
    calc_vector_mean_sse_64wd
              (in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0,
               in_stack_fffffffffffff6d8);
    auVar1 = vpinsrw_avx(ZEXT216(1),1,1);
    auVar1 = vpinsrw_avx(auVar1,1,2);
    auVar1 = vpinsrw_avx(auVar1,1,3);
    auVar1 = vpinsrw_avx(auVar1,1,4);
    auVar1 = vpinsrw_avx(auVar1,1,5);
    auVar1 = vpinsrw_avx(auVar1,1,6);
    auVar1 = vpinsrw_avx(auVar1,1,7);
    auVar2 = vpinsrw_avx(ZEXT216(1),1,1);
    auVar2 = vpinsrw_avx(auVar2,1,2);
    auVar2 = vpinsrw_avx(auVar2,1,3);
    auVar2 = vpinsrw_avx(auVar2,1,4);
    auVar2 = vpinsrw_avx(auVar2,1,5);
    auVar2 = vpinsrw_avx(auVar2,1,6);
    auVar2 = vpinsrw_avx(auVar2,1,7);
    uStack_130 = auVar2._0_8_;
    uStack_128 = auVar2._8_8_;
    auVar7._16_8_ = uStack_130;
    auVar7._0_16_ = auVar1;
    auVar7._24_8_ = uStack_128;
    auVar3 = vpmaddwd_avx2(local_860,auVar7);
    auVar3 = vphaddd_avx2(auVar3,ZEXT1632(ZEXT816(0)));
    auVar7 = vpsrldq_avx2(auVar3,4);
    auVar3 = vpaddd_avx2(auVar3,auVar7);
    auVar1 = vpaddd_avx(auVar3._0_16_,auVar3._16_16_);
    local_890 = auVar1._0_4_;
    iStack_888 = auVar1._8_4_;
    if (local_890 < 1) {
      local_890 = -local_890;
    }
    local_82c = iStack_888 - ((uint)(local_890 * local_890) >> (in_DL + 2 & 0x1f));
  }
  else if (iVar6 == 0x40) {
    calc_vector_mean_sse_64wd
              (in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0,
               in_stack_fffffffffffff6d8);
    auVar1 = vpinsrw_avx(ZEXT216(1),1,1);
    auVar1 = vpinsrw_avx(auVar1,1,2);
    auVar1 = vpinsrw_avx(auVar1,1,3);
    auVar1 = vpinsrw_avx(auVar1,1,4);
    auVar1 = vpinsrw_avx(auVar1,1,5);
    auVar1 = vpinsrw_avx(auVar1,1,6);
    auVar1 = vpinsrw_avx(auVar1,1,7);
    auVar2 = vpinsrw_avx(ZEXT216(1),1,1);
    auVar2 = vpinsrw_avx(auVar2,1,2);
    auVar2 = vpinsrw_avx(auVar2,1,3);
    auVar2 = vpinsrw_avx(auVar2,1,4);
    auVar2 = vpinsrw_avx(auVar2,1,5);
    auVar2 = vpinsrw_avx(auVar2,1,6);
    auVar2 = vpinsrw_avx(auVar2,1,7);
    uStack_f0 = auVar2._0_8_;
    uStack_e8 = auVar2._8_8_;
    auVar3._16_8_ = uStack_f0;
    auVar3._0_16_ = auVar1;
    auVar3._24_8_ = uStack_e8;
    auVar3 = vpmaddwd_avx2(ZEXT1632(ZEXT816(0)),auVar3);
    auVar3 = vphaddd_avx2(auVar3,ZEXT1632(ZEXT816(0)));
    auVar7 = vpsrldq_avx2(auVar3,4);
    auVar3 = vpaddd_avx2(auVar3,auVar7);
    auVar1 = vpaddd_avx(auVar3._0_16_,auVar3._16_16_);
    local_8f0 = auVar1._0_4_;
    iStack_8e8 = auVar1._8_4_;
    if (local_8f0 < 1) {
      local_8f0 = -local_8f0;
    }
    local_82c = iStack_8e8 - ((uint)(local_8f0 * local_8f0) >> (in_DL + 2 & 0x1f));
  }
  else if (iVar6 == 0x20) {
    auVar4 = vpsubw_avx2(*in_RDI,*in_RSI);
    auVar5 = vpsubw_avx2(in_RDI[1],in_RSI[1]);
    auVar3 = vpmaddwd_avx2(auVar4,auVar4);
    auVar7 = vpmaddwd_avx2(auVar5,auVar5);
    auVar7 = vpaddd_avx2(auVar3,auVar7);
    auVar3 = vpaddw_avx2(auVar4,auVar5);
    auVar1 = vpinsrw_avx(ZEXT216(1),1,1);
    auVar1 = vpinsrw_avx(auVar1,1,2);
    auVar1 = vpinsrw_avx(auVar1,1,3);
    auVar1 = vpinsrw_avx(auVar1,1,4);
    auVar1 = vpinsrw_avx(auVar1,1,5);
    auVar1 = vpinsrw_avx(auVar1,1,6);
    auVar1 = vpinsrw_avx(auVar1,1,7);
    auVar2 = vpinsrw_avx(ZEXT216(1),1,1);
    auVar2 = vpinsrw_avx(auVar2,1,2);
    auVar2 = vpinsrw_avx(auVar2,1,3);
    auVar2 = vpinsrw_avx(auVar2,1,4);
    auVar2 = vpinsrw_avx(auVar2,1,5);
    auVar2 = vpinsrw_avx(auVar2,1,6);
    auVar2 = vpinsrw_avx(auVar2,1,7);
    uStack_b0 = auVar2._0_8_;
    uStack_a8 = auVar2._8_8_;
    auVar5._16_8_ = uStack_b0;
    auVar5._0_16_ = auVar1;
    auVar5._24_8_ = uStack_a8;
    auVar3 = vpmaddwd_avx2(auVar3,auVar5);
    auVar3 = vphaddd_avx2(auVar3,auVar7);
    auVar7 = vpsrldq_avx2(auVar3,4);
    auVar3 = vpaddd_avx2(auVar3,auVar7);
    auVar1 = vpaddd_avx(auVar3._0_16_,auVar3._16_16_);
    local_a50 = auVar1._0_4_;
    iStackY_a48 = auVar1._8_4_;
    if (local_a50 < 1) {
      local_a50 = -local_a50;
    }
    local_82c = iStackY_a48 - ((uint)(local_a50 * local_a50) >> (in_DL + 2 & 0x1f));
  }
  else if (iVar6 == 0x10) {
    auVar7 = vpsubw_avx2(*in_RDI,*in_RSI);
    auVar3 = vpmaddwd_avx2(auVar7,auVar7);
    auVar1 = vpinsrw_avx(ZEXT216(1),1,1);
    auVar1 = vpinsrw_avx(auVar1,1,2);
    auVar1 = vpinsrw_avx(auVar1,1,3);
    auVar1 = vpinsrw_avx(auVar1,1,4);
    auVar1 = vpinsrw_avx(auVar1,1,5);
    auVar1 = vpinsrw_avx(auVar1,1,6);
    auVar1 = vpinsrw_avx(auVar1,1,7);
    auVar2 = vpinsrw_avx(ZEXT216(1),1,1);
    auVar2 = vpinsrw_avx(auVar2,1,2);
    auVar2 = vpinsrw_avx(auVar2,1,3);
    auVar2 = vpinsrw_avx(auVar2,1,4);
    auVar2 = vpinsrw_avx(auVar2,1,5);
    auVar2 = vpinsrw_avx(auVar2,1,6);
    auVar2 = vpinsrw_avx(auVar2,1,7);
    uStack_70 = auVar2._0_8_;
    uStack_68 = auVar2._8_8_;
    auVar4._16_8_ = uStack_70;
    auVar4._0_16_ = auVar1;
    auVar4._24_8_ = uStack_68;
    auVar7 = vpmaddwd_avx2(auVar7,auVar4);
    auVar3 = vphaddd_avx2(auVar7,auVar3);
    auVar7 = vpsrldq_avx2(auVar3,4);
    auVar3 = vpaddd_avx2(auVar3,auVar7);
    auVar1 = vpaddd_avx(auVar3._0_16_,auVar3._16_16_);
    local_af0 = auVar1._0_4_;
    iStackY_ae8 = auVar1._8_4_;
    if (local_af0 < 1) {
      local_af0 = -local_af0;
    }
    local_82c = iStackY_ae8 - ((uint)(local_af0 * local_af0) >> (in_DL + 2 & 0x1f));
  }
  return local_82c;
}

Assistant:

int aom_vector_var_avx2(const int16_t *ref, const int16_t *src, int bwl) {
  const int width = 4 << bwl;
  assert(width % 16 == 0 && width <= 128);
  int var = 0;

  // Instead of having a loop over width 16, considered loop unrolling to avoid
  // some addition operations.
  if (width == 128) {
    __m256i mean = _mm256_setzero_si256();
    __m256i sse = _mm256_setzero_si256();

    calc_vector_mean_sse_64wd(src, ref, &mean, &sse);
    calc_vector_mean_sse_64wd(src + 64, ref + 64, &mean, &sse);
    CALC_VAR_FROM_MEAN_SSE(mean, sse)
  } else if (width == 64) {
    __m256i mean = _mm256_setzero_si256();
    __m256i sse = _mm256_setzero_si256();

    calc_vector_mean_sse_64wd(src, ref, &mean, &sse);
    CALC_VAR_FROM_MEAN_SSE(mean, sse)
  } else if (width == 32) {
    const __m256i src_line0 = _mm256_loadu_si256((const __m256i *)src);
    const __m256i ref_line0 = _mm256_loadu_si256((const __m256i *)ref);
    const __m256i src_line1 = _mm256_loadu_si256((const __m256i *)(src + 16));
    const __m256i ref_line1 = _mm256_loadu_si256((const __m256i *)(ref + 16));

    const __m256i diff0 = _mm256_sub_epi16(ref_line0, src_line0);
    const __m256i diff1 = _mm256_sub_epi16(ref_line1, src_line1);
    const __m256i diff_sqr0 = _mm256_madd_epi16(diff0, diff0);
    const __m256i diff_sqr1 = _mm256_madd_epi16(diff1, diff1);
    const __m256i sse = _mm256_add_epi32(diff_sqr0, diff_sqr1);
    __m256i mean = _mm256_add_epi16(diff0, diff1);

    CALC_VAR_FROM_MEAN_SSE(mean, sse)
  } else if (width == 16) {
    const __m256i src_line = _mm256_loadu_si256((const __m256i *)src);
    const __m256i ref_line = _mm256_loadu_si256((const __m256i *)ref);
    __m256i mean = _mm256_sub_epi16(ref_line, src_line);
    const __m256i sse = _mm256_madd_epi16(mean, mean);

    CALC_VAR_FROM_MEAN_SSE(mean, sse)
  }
  return var;
}